

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::operator*(RangeValue *this,RangeValue *other)

{
  bool bVar1;
  size_t other_00;
  RangeValue RVar2;
  RangeValue RVar3;
  undefined1 local_38 [8];
  RangeValue retval;
  RangeValue *other_local;
  RangeValue *this_local;
  size_t local_10;
  
  retval._val = (size_t)other;
  RangeValue((RangeValue *)local_38);
  bVar1 = isUnbound((RangeValue *)retval._val);
  if (bVar1) {
    this_local._0_1_ = local_38[0];
    RVar2._val = retval._0_8_;
    RVar2._isUnbound = retval._isUnbound;
    RVar2._1_7_ = retval._1_7_;
  }
  else {
    other_00 = value((RangeValue *)retval._val);
    RVar2 = operator*(this,other_00);
    this_local._0_1_ = RVar2._isUnbound;
  }
  local_10 = RVar2._val;
  RVar3._1_7_ = RVar2._1_7_;
  RVar3._isUnbound = (bool)this_local._0_1_;
  RVar3._val = local_10;
  return RVar3;
}

Assistant:

RangeValue RangeValue::operator* (const RangeValue& other) const {
    RangeValue retval;
    if (other.isUnbound())
        return retval;
    else {
        return (*this)*other.value();
    }
}